

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O1

void __thiscall CVmObjList::CVmObjList(CVmObjList *this,char *lst)

{
  ushort uVar1;
  
  (this->super_CVmObjCollection).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_003106d8;
  uVar1 = *(ushort *)lst;
  alloc_list(this,(ulong)uVar1);
  memcpy((this->super_CVmObjCollection).super_CVmObject.ext_,lst,(ulong)uVar1 * 5 + 2);
  return;
}

Assistant:

CVmObjList::CVmObjList(VMG_ const char *lst)
{
    /* get the element count from the original list */
    size_t cnt = vmb_get_len(lst);

    /* allocate space */
    alloc_list(vmg_ cnt);

    /* copy the list's contents */
    memcpy(ext_, lst, calc_alloc(cnt));
}